

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Graph *g)

{
  Annotation AStack_48;
  
  AST::Annotation::toPlainAnnotation
            (&AStack_48,&(g->super_ProcessorBase).annotation,
             &((this->module->program).pimpl)->stringDictionary);
  Annotation::operator=(&this->module->annotation,&AStack_48);
  Annotation::~Annotation(&AStack_48);
  (this->sourceGraph).object = g;
  this->parsingStateVariables = true;
  ASTVisitor::visit(&this->super_ASTVisitor,g);
  this->parsingStateVariables = false;
  return;
}

Assistant:

void visit (AST::Graph& g) override
    {
        module.annotation = g.annotation.toPlainAnnotation (module.program.getStringDictionary());
        sourceGraph = g;

        parsingStateVariables = true;
        super::visit (g);
        parsingStateVariables = false;
    }